

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O2

void StoreCommands(BrotliTwoPassArena *s,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  uint32_t *data;
  HuffmanTree *tree;
  uint8_t *depth;
  uint8_t *depth_00;
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  bool bVar17;
  
  switchD_004a0b15::default(s,0,0x400);
  data = s->cmd_histo;
  switchD_004a0b15::default(data,0,0x380);
  for (sVar15 = 0; num_literals != sVar15; sVar15 = sVar15 + 1) {
    s->lit_histo[literals[sVar15]] = s->lit_histo[literals[sVar15]] + 1;
  }
  tree = s->tmp_tree;
  duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast
            (tree,s->lit_histo,num_literals,8,s->lit_depth,s->lit_bits,storage_ix,storage);
  for (sVar15 = 0; num_commands != sVar15; sVar15 = sVar15 + 1) {
    data[(byte)commands[sVar15]] = data[(byte)commands[sVar15]] + 1;
  }
  *(ulong *)(s->cmd_histo + 1) =
       CONCAT44((int)((ulong)*(undefined8 *)(s->cmd_histo + 1) >> 0x20) + 1,
                (int)*(undefined8 *)(s->cmd_histo + 1) + 1);
  s->cmd_histo[0x40] = s->cmd_histo[0x40] + 1;
  s->cmd_histo[0x54] = s->cmd_histo[0x54] + 1;
  depth = s->tmp_depth;
  switchD_004a0b15::default(depth,0,0x2c0);
  duckdb_brotli::BrotliCreateHuffmanTree(data,0x40,0xf,tree,s->cmd_depth);
  depth_00 = s->cmd_depth + 0x40;
  duckdb_brotli::BrotliCreateHuffmanTree(s->cmd_histo + 0x40,0x40,0xe,tree,depth_00);
  *(undefined8 *)(s->tmp_depth + 0x10) = *(undefined8 *)(s->cmd_depth + 0x28);
  uVar3 = *(undefined8 *)(s->cmd_depth + 0x20);
  *(undefined8 *)s->tmp_depth = *(undefined8 *)(s->cmd_depth + 0x18);
  *(undefined8 *)(s->tmp_depth + 8) = uVar3;
  uVar3 = *(undefined8 *)(s->cmd_depth + 8);
  *(undefined8 *)(s->tmp_depth + 0x18) = *(undefined8 *)s->cmd_depth;
  *(undefined8 *)(s->tmp_depth + 0x20) = *(undefined8 *)(s->cmd_depth + 0x30);
  *(undefined8 *)(s->tmp_depth + 0x28) = uVar3;
  *(undefined8 *)(s->tmp_depth + 0x30) = *(undefined8 *)(s->cmd_depth + 0x38);
  *(undefined8 *)(s->tmp_depth + 0x38) = *(undefined8 *)(s->cmd_depth + 0x10);
  duckdb_brotli::BrotliConvertBitDepthsToSymbols(depth,0x40,s->tmp_bits);
  uVar3 = *(undefined8 *)(s->tmp_bits + 0x1c);
  *(undefined8 *)s->cmd_bits = *(undefined8 *)(s->tmp_bits + 0x18);
  *(undefined8 *)(s->cmd_bits + 4) = uVar3;
  uVar3 = *(undefined8 *)(s->tmp_bits + 0x2c);
  *(undefined8 *)(s->cmd_bits + 8) = *(undefined8 *)(s->tmp_bits + 0x28);
  *(undefined8 *)(s->cmd_bits + 0xc) = uVar3;
  uVar3 = *(undefined8 *)(s->tmp_bits + 0x3c);
  *(undefined8 *)(s->cmd_bits + 0x10) = *(undefined8 *)(s->tmp_bits + 0x38);
  *(undefined8 *)(s->cmd_bits + 0x14) = uVar3;
  uVar3 = *(undefined8 *)(s->tmp_bits + 4);
  uVar5 = *(undefined8 *)(s->tmp_bits + 8);
  uVar6 = *(undefined8 *)(s->tmp_bits + 0xc);
  uVar7 = *(undefined8 *)(s->tmp_bits + 0x10);
  uVar8 = *(undefined8 *)(s->tmp_bits + 0x14);
  uVar9 = *(undefined8 *)(s->tmp_bits + 0x20);
  uVar10 = *(undefined8 *)(s->tmp_bits + 0x24);
  *(undefined8 *)(s->cmd_bits + 0x18) = *(undefined8 *)s->tmp_bits;
  *(undefined8 *)(s->cmd_bits + 0x1c) = uVar3;
  *(undefined8 *)(s->cmd_bits + 0x20) = uVar5;
  *(undefined8 *)(s->cmd_bits + 0x24) = uVar6;
  *(undefined8 *)(s->cmd_bits + 0x28) = uVar7;
  *(undefined8 *)(s->cmd_bits + 0x2c) = uVar8;
  *(undefined8 *)(s->cmd_bits + 0x30) = uVar9;
  *(undefined8 *)(s->cmd_bits + 0x34) = uVar10;
  uVar3 = *(undefined8 *)(s->tmp_bits + 0x34);
  *(undefined8 *)(s->cmd_bits + 0x38) = *(undefined8 *)(s->tmp_bits + 0x30);
  *(undefined8 *)(s->cmd_bits + 0x3c) = uVar3;
  duckdb_brotli::BrotliConvertBitDepthsToSymbols(depth_00,0x40,s->cmd_bits + 0x40);
  s->tmp_depth[0x28] = '\0';
  s->tmp_depth[0x29] = '\0';
  s->tmp_depth[0x2a] = '\0';
  s->tmp_depth[0x2b] = '\0';
  s->tmp_depth[0x2c] = '\0';
  s->tmp_depth[0x2d] = '\0';
  s->tmp_depth[0x2e] = '\0';
  s->tmp_depth[0x2f] = '\0';
  s->tmp_depth[0x30] = '\0';
  s->tmp_depth[0x31] = '\0';
  s->tmp_depth[0x32] = '\0';
  s->tmp_depth[0x33] = '\0';
  s->tmp_depth[0x34] = '\0';
  s->tmp_depth[0x35] = '\0';
  s->tmp_depth[0x36] = '\0';
  s->tmp_depth[0x37] = '\0';
  s->tmp_depth[0x38] = '\0';
  s->tmp_depth[0x39] = '\0';
  s->tmp_depth[0x3a] = '\0';
  s->tmp_depth[0x3b] = '\0';
  s->tmp_depth[0x3c] = '\0';
  s->tmp_depth[0x3d] = '\0';
  s->tmp_depth[0x3e] = '\0';
  s->tmp_depth[0x3f] = '\0';
  s->tmp_depth[0x18] = '\0';
  s->tmp_depth[0x19] = '\0';
  s->tmp_depth[0x1a] = '\0';
  s->tmp_depth[0x1b] = '\0';
  s->tmp_depth[0x1c] = '\0';
  s->tmp_depth[0x1d] = '\0';
  s->tmp_depth[0x1e] = '\0';
  s->tmp_depth[0x1f] = '\0';
  s->tmp_depth[0x20] = '\0';
  s->tmp_depth[0x21] = '\0';
  s->tmp_depth[0x22] = '\0';
  s->tmp_depth[0x23] = '\0';
  s->tmp_depth[0x24] = '\0';
  s->tmp_depth[0x25] = '\0';
  s->tmp_depth[0x26] = '\0';
  s->tmp_depth[0x27] = '\0';
  s->tmp_depth[8] = '\0';
  s->tmp_depth[9] = '\0';
  s->tmp_depth[10] = '\0';
  s->tmp_depth[0xb] = '\0';
  s->tmp_depth[0xc] = '\0';
  s->tmp_depth[0xd] = '\0';
  s->tmp_depth[0xe] = '\0';
  s->tmp_depth[0xf] = '\0';
  s->tmp_depth[0x10] = '\0';
  s->tmp_depth[0x11] = '\0';
  s->tmp_depth[0x12] = '\0';
  s->tmp_depth[0x13] = '\0';
  s->tmp_depth[0x14] = '\0';
  s->tmp_depth[0x15] = '\0';
  s->tmp_depth[0x16] = '\0';
  s->tmp_depth[0x17] = '\0';
  uVar3 = *(undefined8 *)(s->cmd_depth + 0x20);
  *(undefined8 *)s->tmp_depth = *(undefined8 *)(s->cmd_depth + 0x18);
  *(undefined8 *)(s->tmp_depth + 0x40) = uVar3;
  *(undefined8 *)(s->tmp_depth + 0x80) = *(undefined8 *)(s->cmd_depth + 0x28);
  *(undefined8 *)(s->tmp_depth + 0xc0) = *(undefined8 *)(s->cmd_depth + 0x30);
  *(undefined8 *)(s->tmp_depth + 0x180) = *(undefined8 *)(s->cmd_depth + 0x38);
  for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
    s->tmp_depth[lVar16 * 8 + 0x80] = s->cmd_depth[lVar16];
    s->tmp_depth[lVar16 * 8 + 0x100] = s->cmd_depth[lVar16 + 8];
    s->tmp_depth[lVar16 * 8 + 0x1c0] = s->cmd_depth[lVar16 + 0x10];
  }
  duckdb_brotli::BrotliStoreHuffmanTree(depth,0x2c0,tree,storage_ix,storage);
  duckdb_brotli::BrotliStoreHuffmanTree(depth_00,0x40,tree,storage_ix,storage);
  for (sVar15 = 0; sVar15 != num_commands; sVar15 = sVar15 + 1) {
    uVar13 = commands[sVar15] & 0xff;
    uVar11 = commands[sVar15] >> 8;
    uVar4 = *storage_ix;
    uVar14 = s->cmd_depth[uVar13] + uVar4;
    *(ulong *)(storage + (uVar4 >> 3)) =
         (ulong)s->cmd_bits[uVar13] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = uVar14;
    uVar2 = StoreCommands::kNumExtraBits[uVar13];
    *(ulong *)(storage + (uVar14 >> 3)) =
         (ulong)uVar11 << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
    uVar14 = uVar2 + uVar14;
    *storage_ix = uVar14;
    if (uVar13 < 0x18) {
      iVar12 = uVar11 + StoreCommands::kInsertOffset[uVar13];
      while (bVar17 = iVar12 != 0, iVar12 = iVar12 + -1, bVar17) {
        bVar1 = s->lit_depth[*literals];
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)s->lit_bits[*literals] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
        uVar14 = uVar14 + bVar1;
        *storage_ix = uVar14;
        literals = literals + 1;
      }
    }
  }
  return;
}

Assistant:

static void StoreCommands(BrotliTwoPassArena* s,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
      0,  0,  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,  5,  5,
      6,  7,  8,  9,  10, 12, 14, 24, 0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  5,  5,  6,  7,  8,  9,  10, 24,
      0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,
      1,  1,  2,  2,  3,  3,  4,  4,  5,  5,  6,  6,  7,  7,  8,  8,
      9,  9,  10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
      0,  1,  2,  3,  4,   5,   6,   8,   10,   14,   18,   26,
      34, 50, 66, 98, 130, 194, 322, 578, 1090, 2114, 6210, 22594,
  };

  size_t i;
  memset(s->lit_histo, 0, sizeof(s->lit_histo));
  /* TODO(eustas): is that necessary? */
  memset(s->cmd_depth, 0, sizeof(s->cmd_depth));
  /* TODO(eustas): is that necessary? */
  memset(s->cmd_bits, 0, sizeof(s->cmd_bits));
  memset(s->cmd_histo, 0, sizeof(s->cmd_histo));
  for (i = 0; i < num_literals; ++i) {
    ++s->lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(s->tmp_tree, s->lit_histo, num_literals,
                                     /* max_bits = */ 8, s->lit_depth,
                                     s->lit_bits, storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++s->cmd_histo[code];
  }
  s->cmd_histo[1] += 1;
  s->cmd_histo[2] += 1;
  s->cmd_histo[64] += 1;
  s->cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(s, storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(s->cmd_depth[code], s->cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(s->lit_depth[lit], s->lit_bits[lit], storage_ix,
                        storage);
        ++literals;
      }
    }
  }
}